

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O2

array<pbrt::Point3<float>,_4> * __thiscall
pbrt::CubicBezierControlPoints<pbrt::Point3<float>>
          (array<pbrt::Point3<float>,_4> *__return_storage_ptr__,pbrt *this,
          span<const_pbrt::Point3<float>_> cp,Float uMin,Float uMax)

{
  Point3<float> *pPVar1;
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Point3<float> PVar7;
  span<const_pbrt::Point3<float>_> p;
  span<const_pbrt::Point3<float>_> p_00;
  span<const_pbrt::Point3<float>_> p_01;
  span<const_pbrt::Point3<float>_> p_02;
  initializer_list<pbrt::Point3<float>_> v;
  Tuple3<pbrt::Point3,_float> local_50;
  undefined8 local_44;
  float local_3c;
  undefined8 local_38;
  float local_30;
  undefined8 local_2c;
  float local_24;
  
  auVar6 = in_register_00001204._4_56_;
  pPVar1 = cp.ptr;
  p.n = (size_t)pPVar1;
  p.ptr = (Point3<float> *)this;
  PVar7 = BlossomCubicBezier<pbrt::Point3<float>>(p,uMin,uMin,uMin);
  local_50.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar6;
  local_50._0_8_ = vmovlps_avx(auVar2._0_16_);
  auVar6 = (undefined1  [56])0x0;
  p_00.n = (size_t)pPVar1;
  p_00.ptr = (Point3<float> *)this;
  PVar7 = BlossomCubicBezier<pbrt::Point3<float>>(p_00,uMin,uMin,uMax);
  local_3c = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  local_44 = vmovlps_avx(auVar3._0_16_);
  auVar6 = (undefined1  [56])0x0;
  p_01.n = (size_t)pPVar1;
  p_01.ptr = (Point3<float> *)this;
  PVar7 = BlossomCubicBezier<pbrt::Point3<float>>(p_01,uMin,uMax,uMax);
  local_30 = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  local_38 = vmovlps_avx(auVar4._0_16_);
  auVar6 = (undefined1  [56])0x0;
  p_02.n = (size_t)pPVar1;
  p_02.ptr = (Point3<float> *)this;
  PVar7 = BlossomCubicBezier<pbrt::Point3<float>>(p_02,uMax,uMax,uMax);
  local_24 = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  local_2c = vmovlps_avx(auVar5._0_16_);
  v._M_len = 4;
  v._M_array = (iterator)&local_50;
  pstd::array<pbrt::Point3<float>,_4>::array(__return_storage_ptr__,v);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline pstd::array<P, 4> CubicBezierControlPoints(pstd::span<const P> cp,
                                                               Float uMin, Float uMax) {
    return {BlossomCubicBezier(cp, uMin, uMin, uMin),
            BlossomCubicBezier(cp, uMin, uMin, uMax),
            BlossomCubicBezier(cp, uMin, uMax, uMax),
            BlossomCubicBezier(cp, uMax, uMax, uMax)};
}